

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBox::setEditable(QComboBox *this,bool editable)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  QComboBoxPrivate *this_00;
  QStyle *pQVar5;
  byte in_SIL;
  QPalette *in_RDI;
  long in_FS_OFFSET;
  QLineEdit *le;
  QComboBoxPrivate *d;
  QStyleOptionComboBox opt;
  QWidget *in_stack_ffffffffffffff28;
  QStyleOptionComboBox *in_stack_ffffffffffffff30;
  QStyleOptionComboBox *in_stack_ffffffffffffff38;
  QComboBoxPrivateContainer *in_stack_ffffffffffffff48;
  QStyleOptionComboBox *this_01;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 local_98 [43];
  undefined1 in_stack_ffffffffffffff93;
  WidgetAttribute in_stack_ffffffffffffff94;
  QWidget *in_stack_ffffffffffffff98;
  QComboBoxPrivate *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_SIL & 1;
  this_00 = d_func((QComboBox *)0x5381b9);
  bVar3 = isEditable((QComboBox *)in_stack_ffffffffffffff30);
  if (bVar3 != (bool)(bVar2 & 1)) {
    memset(local_98,0xaa,0x90);
    QStyleOptionComboBox::QStyleOptionComboBox((QStyleOptionComboBox *)0x5381fe);
    (**(code **)(*(long *)&((QFrame *)&in_RDI->d)->super_QWidget + 0x1b8))(in_RDI,local_98);
    if ((bVar2 & 1) == 0) {
      pQVar5 = QWidget::style(in_stack_ffffffffffffff28);
      iVar4 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x19,local_98,in_RDI,0);
      if (iVar4 != 0) {
        QComboBoxPrivate::viewContainer(in_stack_ffffffffffffffa8);
        QComboBoxPrivateContainer::updateScrollers(in_stack_ffffffffffffff48);
        view((QComboBox *)in_stack_ffffffffffffff30);
        QAbstractScrollArea::setVerticalScrollBarPolicy
                  ((QAbstractScrollArea *)in_RDI,
                   (ScrollBarPolicy)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      }
      QWidget::setAttribute
                (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,(bool)in_stack_ffffffffffffff93
                );
      QWidget::hide((QWidget *)0x538342);
      QObject::deleteLater();
      this_00->lineEdit = (QLineEdit *)0x0;
    }
    else {
      pQVar5 = QWidget::style(in_stack_ffffffffffffff28);
      iVar4 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x19,local_98,in_RDI,0);
      if (iVar4 != 0) {
        QComboBoxPrivate::viewContainer(in_stack_ffffffffffffffa8);
        QComboBoxPrivateContainer::updateScrollers(in_stack_ffffffffffffff48);
        view((QComboBox *)in_stack_ffffffffffffff30);
        QAbstractScrollArea::setVerticalScrollBarPolicy
                  ((QAbstractScrollArea *)in_RDI,
                   (ScrollBarPolicy)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      }
      in_stack_ffffffffffffff30 = (QStyleOptionComboBox *)operator_new(0x28);
      QLineEdit::QLineEdit((QLineEdit *)in_RDI,(QWidget *)in_stack_ffffffffffffff38);
      in_stack_ffffffffffffff38 = in_stack_ffffffffffffff30;
      this_01 = in_stack_ffffffffffffff30;
      QWidget::palette((QWidget *)in_stack_ffffffffffffff30);
      QWidget::setPalette((QWidget *)this_01,in_RDI);
      setLineEdit((QComboBox *)d,le);
    }
    QComboBoxPrivate::updateDelegate
              ((QComboBoxPrivate *)CONCAT17(bVar2,in_stack_ffffffffffffff58),
               SUB81((ulong)this_00 >> 0x38,0));
    QComboBoxPrivate::updateFocusPolicy(this_00);
    QComboBoxPrivate::viewContainer(in_stack_ffffffffffffffa8);
    QComboBoxPrivateContainer::updateTopBottomMargin
              ((QComboBoxPrivateContainer *)CONCAT17(bVar2,in_stack_ffffffffffffff58));
    bVar3 = QWidget::testAttribute
                      ((QWidget *)in_stack_ffffffffffffff38,
                       (WidgetAttribute)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    if (!bVar3) {
      QWidget::adjustSize((QWidget *)in_stack_ffffffffffffff30);
    }
    QStyleOptionComboBox::~QStyleOptionComboBox(in_stack_ffffffffffffff30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBox::setEditable(bool editable)
{
    Q_D(QComboBox);
    if (isEditable() == editable)
        return;

    QStyleOptionComboBox opt;
    initStyleOption(&opt);
    if (editable) {
        if (style()->styleHint(QStyle::SH_ComboBox_Popup, &opt, this)) {
            d->viewContainer()->updateScrollers();
            view()->setVerticalScrollBarPolicy(Qt::ScrollBarAsNeeded);
        }
        QLineEdit *le = new QLineEdit(this);
        le->setPalette(palette());
        setLineEdit(le);
    } else {
        if (style()->styleHint(QStyle::SH_ComboBox_Popup, &opt, this)) {
            d->viewContainer()->updateScrollers();
            view()->setVerticalScrollBarPolicy(Qt::ScrollBarAlwaysOff);
        }
        setAttribute(Qt::WA_InputMethodEnabled, false);
        d->lineEdit->hide();
        d->lineEdit->deleteLater();
        d->lineEdit = nullptr;
    }

    d->updateDelegate();
    d->updateFocusPolicy();

    d->viewContainer()->updateTopBottomMargin();
    if (!testAttribute(Qt::WA_Resized))
        adjustSize();
}